

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

ColorTracker * __thiscall ColorTracker::getCaptureImage(ColorTracker *this)

{
  byte bVar1;
  ostream *poVar2;
  CameraException *pCVar3;
  long in_RSI;
  allocator local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  allocator local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  _OutputArray local_198;
  byte local_17b;
  undefined1 local_17a;
  allocator local_179;
  undefined1 local_178 [5];
  bool ret;
  string local_158;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  ColorTracker *this_local;
  Mat *img;
  
  local_19 = 0;
  this_local = this;
  cv::Mat::Mat((Mat *)this);
  bVar1 = cv::VideoCapture::isOpened();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"failed to open camera");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_17a = 1;
    pCVar3 = (CameraException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
               ,&local_131);
    std::operator+(&local_110,"in ",&local_130);
    std::operator+(&local_f0,&local_110,", at Line ");
    std::__cxx11::to_string(&local_158,0x59);
    std::operator+(&local_d0,&local_f0,&local_158);
    std::operator+(&local_b0,&local_d0,", ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_178,"getCaptureImage",&local_179);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    std::operator+(&local_70,&local_90,"(): ");
    std::operator+(&local_50,&local_70,"failed to open camera");
    CameraException::CameraException(pCVar3,&local_50);
    local_17a = 0;
    __cxa_throw(pCVar3,&CameraException::typeinfo,CameraException::~CameraException);
  }
  cv::_OutputArray::_OutputArray(&local_198,(Mat *)this);
  bVar1 = cv::VideoCapture::read((_OutputArray *)(in_RSI + 8));
  cv::_OutputArray::~_OutputArray(&local_198);
  local_17b = bVar1 & 1;
  if (local_17b != 0) {
    return this;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"failed to get frame");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pCVar3 = (CameraException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_299);
  std::operator+(&local_278,"in ",&local_298);
  std::operator+(&local_258,&local_278,", at Line ");
  std::__cxx11::to_string(&local_2c0,0x5e);
  std::operator+(&local_238,&local_258,&local_2c0);
  std::operator+(&local_218,&local_238,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"getCaptureImage",&local_2e1);
  std::operator+(&local_1f8,&local_218,&local_2e0);
  std::operator+(&local_1d8,&local_1f8,"(): ");
  std::operator+(&local_1b8,&local_1d8,"failed to get frame");
  CameraException::CameraException(pCVar3,&local_1b8);
  __cxa_throw(pCVar3,&CameraException::typeinfo,CameraException::~CameraException);
}

Assistant:

Mat ColorTracker::getCaptureImage() noexcept(false){
    Mat img;
    if(!this->cap.isOpened()){
        cout << "failed to open camera" << endl;
		throw CameraException(WHERE + "failed to open camera");
    } else {
        bool ret = this->cap.read(img);
        if(!ret){
            cout << "failed to get frame" << endl;
		    throw CameraException(WHERE + "failed to get frame");
        }
    }
    return img;

}